

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlsa_digital_filter_stability_check.h
# Opt level: O1

void __thiscall sptk::MlsaDigitalFilterStabilityCheck::Buffer::~Buffer(Buffer *this)

{
  ~Buffer(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Buffer() {
    }